

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O1

pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>::
insert_simplex_and_subfaces<std::initializer_list<int>>
          (Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence> *this,
          initializer_list<int> *Nsimplex,Filtration_value *filtration)

{
  long lVar1;
  Filtration_value *filt;
  long lVar2;
  int iVar3;
  ulong uVar4;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var5;
  long lVar6;
  undefined8 *puVar7;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var8;
  long *in_FS_OFFSET;
  pair<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>_*,_true>,_bool>
  pVar9;
  
  lVar6 = *(long *)(filtration + 2);
  if (lVar6 == 0) {
    (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
    *(undefined1 *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = 1;
  }
  else {
    lVar1 = *(long *)filtration;
    if ((char)in_FS_OFFSET[-0xd] == '\0') {
      insert_simplex_and_subfaces<std::initializer_list<int>>();
    }
    if (in_FS_OFFSET[-0xf] != in_FS_OFFSET[-0x10]) {
      in_FS_OFFSET[-0xf] = in_FS_OFFSET[-0x10];
    }
    std::vector<int,std::allocator<int>>::_M_range_insert<int_const*>
              ((vector<int,std::allocator<int>> *)(*in_FS_OFFSET + -0x80),in_FS_OFFSET[-0xf],lVar1,
               lVar1 + lVar6 * 4);
    lVar6 = in_FS_OFFSET[-0x10];
    lVar1 = in_FS_OFFSET[-0xf];
    if (lVar6 != lVar1) {
      uVar4 = lVar1 - lVar6 >> 2;
      lVar2 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (lVar6,lVar1,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (lVar6,lVar1);
    }
    _Var5 = std::
            __unique<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                      (in_FS_OFFSET[-0x10],in_FS_OFFSET[-0xf]);
    if ((_Var5._M_current != (int *)in_FS_OFFSET[-0xf]) &&
       (lVar6 = (long)_Var5._M_current + (in_FS_OFFSET[-0xf] - in_FS_OFFSET[-0xf]),
       in_FS_OFFSET[-0xf] != lVar6)) {
      in_FS_OFFSET[-0xf] = lVar6;
    }
    _Var5._M_current = (int *)in_FS_OFFSET[-0x10];
    filt = (Filtration_value *)in_FS_OFFSET[-0xf];
    if ((Filtration_value *)_Var5._M_current != filt) {
      _Var8._M_current = _Var5._M_current;
      do {
        if ((Filtration_value)*_Var8._M_current == *(Filtration_value *)&Nsimplex[3]._M_len) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar7 = "cannot use the dummy null_vertex() as a real vertex";
          __cxa_throw(puVar7,&char_const*::typeinfo,0);
        }
        _Var8._M_current = _Var8._M_current + 1;
      } while ((Filtration_value *)_Var8._M_current != filt);
    }
    iVar3 = (int)((ulong)((long)filt - (long)_Var5._M_current) >> 2) + -1;
    if (iVar3 < *(int *)&Nsimplex[8]._M_array) {
      iVar3 = *(int *)&Nsimplex[8]._M_array;
    }
    *(int *)&Nsimplex[8]._M_array = iVar3;
    pVar9 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      (this,(Siblings *)Nsimplex,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       (Nsimplex + 4),_Var5,filt);
    filtration = pVar9._8_8_;
  }
  pVar9._8_8_ = filtration;
  pVar9.first.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_fast_persistence>_>_>
        *)this;
  return pVar9;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }